

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O1

void __thiscall
ConfidentialTxOutReference_Unblind_Test::TestBody(ConfidentialTxOutReference_Unblind_Test *this)

{
  pointer *ppuVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool *pbVar3;
  bool bVar4;
  char *pcVar5;
  Amount AVar6;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  UnblindParameter unblind_data;
  ConfidentialNonce nonce_commitment;
  ConfidentialValue value_commitment;
  ConfidentialAssetId asset_commitment;
  Privkey blinding_key;
  ByteData rangeproof;
  ConfidentialTxOut txout;
  Script locking_script;
  AssertHelper local_2c0;
  undefined1 local_2b8 [16];
  string local_2a8;
  UnblindParameter local_288;
  ConfidentialNonce local_1f8;
  ConfidentialValue local_1d0;
  ConfidentialAssetId local_1a8;
  int64_t local_180;
  Privkey local_178;
  ByteData local_158;
  ConfidentialTxOut local_140;
  Script local_48;
  
  pbVar3 = &local_140.super_AbstractTxOut.value_.ignore_check_;
  local_140.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)pbVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_140,"a914001d6db698e75a5a8af771730c4ab258af30546b87","");
  cfd::core::Script::Script(&local_48,(string *)&local_140);
  if (local_140.super_AbstractTxOut._vptr_AbstractTxOut != (_func_int **)pbVar3) {
    operator_delete(local_140.super_AbstractTxOut._vptr_AbstractTxOut);
  }
  local_140.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)pbVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_140,
             "0bb0852f9c11249a0c8ebb1c1bc3f99c5f643fa3426d4e5c730e702aaf3f2581fc","");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_1a8,(string *)&local_140);
  if (local_140.super_AbstractTxOut._vptr_AbstractTxOut != (_func_int **)pbVar3) {
    operator_delete(local_140.super_AbstractTxOut._vptr_AbstractTxOut);
  }
  local_140.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)pbVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_140,
             "091dd6cd19781f14385175b586607221d1f11b3f19f149e707810de78f7c7f6f79","");
  cfd::core::ConfidentialValue::ConfidentialValue(&local_1d0,(string *)&local_140);
  if (local_140.super_AbstractTxOut._vptr_AbstractTxOut != (_func_int **)pbVar3) {
    operator_delete(local_140.super_AbstractTxOut._vptr_AbstractTxOut);
  }
  local_140.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)pbVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_140,
             "0398e7cd1cb3c9c13506f91b946f5586cc8fa45f36dde615f2bdb48c1dfe904270","");
  cfd::core::ConfidentialNonce::ConfidentialNonce(&local_1f8,(string *)&local_140);
  if (local_140.super_AbstractTxOut._vptr_AbstractTxOut != (_func_int **)pbVar3) {
    operator_delete(local_140.super_AbstractTxOut._vptr_AbstractTxOut);
  }
  local_140.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)pbVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_140,
             "6033000000000000000121579e0109f21bb7cd0326804abb14059b54fa186892f060384435402393a6589fb54df6ede461ce206af5b13abbe1a564404abf7ab1cc4ed6bd1d93a91728224b21c10a540d76f0ccc047ffa3e06a8abad69687213373d5bcfd4fcf62ecd11c2aff9e1a9d64602cab441e3777d771f88f7e805223a5f192ed3d63b937e93e0e170e6b76e8a05fc5bb46826967d4850dbd2e9128ed615e71149f9aac9304194e968cd8b1ad28a96230b4064795040d16554776ee40b3793bdc9758285df2bc90a5c4be023d206293c071962939160f640ecedbba5a3731aa0aa60afd94f2d9a9d366b4e55ec8c561455ba6a849f8f0df0b19eaf98993655102500a47b76ad320522e4c1f9f829333331017cd0040226f60e426fc00b3844d08e364f6c9f346e3eb7dcf8de6e12a2ac98f11bed6b0c3e06c0bf767e96414ec276a2eb145f64eccb663b46135a19ac17cce785f15b1b2cb7206483329f4c38236ad3cd6cf1646a95ddb94beccb237dc6a854098b139df24f2c8ce7ce7e6d799a434f415ba52ce643bd51619edd786df734b0cee6a5a9ff0442f50a0ca011d8e5b695e6a44016884dbf2f6f681bc3faa5a1a9be514b87ab47183a85bd98b6eff7d5865246b7564a3008cba9b5bcac11e8b3b76dcc38c5915f14a1c7c08a76a31de11d9084cc0553871d0fb9e6ca25b2d191eb292c8f14c1b0cf9c4fedd0a85989a388c675e51003722bae92e356dd680a68f9861fc99be81bdc4f57fa0bf6f63613f80598960aacb8867a94cfbea8d4b776a4771ce1e8b20cf8506cd0524ba85e117085addf4de1d45c2ec6f8e441f74081b792208050ae890a91d5554e37d33ddba2b2c0bbdc2b4a31d0f7eaa1538e5a9fcbd86a87fdf5c6f161c0de5bdc9331b5936b06470c16778077887b3c80a53c5372914d2c3fffd5cb88ee00ffbbbdb10d7ce0fbbca1e725438b7f51a81b611b9f0c4330c3ec3b8d191218fc720c3165305412425f73efacdf44fb0cda9bd1f5290cac09a7f27ca68cb9b485d83c822282cadbfab69ef4f079d1d9e6042033a4a2c8ee9203509f9669f0553ece40d2958d3a733b81232b6ef6c21adc2e2716942588146d6dcadcdc94a13326c6828d04692da1a129e73a3f60cdd30d16b19b29f15a734ddcee491159fedec88a6c986e0243e99b9d2ceed1b9b8c7b3180857f067d8d778f8c0d19ef059f4bf2de3de7f3fc26c86a37cf046fae93cbaaf06e9d95ed73e95957aa69c2680087c6b36d51f93d8e3b9596ab4d793619e70a61edd12c14dc928cc56d1047ea3383b77d8d7527fe43317b21c86a323ed982ed1b766698dcda6c6a91bf50d3f01d7f1d8c20b44441cab3eeb5fac0995298eb7a7a6877bc420119a9acc713e221ddcd2038423c431247dd328372744aea39b9797a9757e46f9d83c5bcce8e2af2baef8416..." /* TRUNCATED STRING LITERAL */
             ,"");
  cfd::core::ByteData::ByteData(&local_158,(string *)&local_140);
  if (local_140.super_AbstractTxOut._vptr_AbstractTxOut != (_func_int **)pbVar3) {
    operator_delete(local_140.super_AbstractTxOut._vptr_AbstractTxOut);
  }
  cfd::core::ByteData::ByteData((ByteData *)&local_288);
  cfd::core::ConfidentialTxOut::ConfidentialTxOut
            (&local_140,&local_48,&local_1a8,&local_1d0,&local_1f8,(ByteData *)&local_288,&local_158
            );
  if (local_288.asset._vptr_ConfidentialAssetId != (_func_int **)0x0) {
    operator_delete(local_288.asset._vptr_ConfidentialAssetId);
  }
  ppuVar1 = (pointer *)
            ((long)&local_288.asset.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8);
  local_288.asset._vptr_ConfidentialAssetId = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_288,"66e4df5035a64acef16b4aa52ddc8bebd22b22c9eca150774e355abc72909d83"
             ,"");
  cfd::core::Privkey::Privkey(&local_178,(string *)&local_288,kMainnet,true);
  if (local_288.asset._vptr_ConfidentialAssetId != (_func_int **)ppuVar1) {
    operator_delete(local_288.asset._vptr_ConfidentialAssetId);
  }
  cfd::core::ConfidentialTxOut::Unblind(&local_288,&local_140,&local_178);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_2a8,&local_288.asset);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)local_2b8,
             "\"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225\"",
             "unblind_data.asset.GetHex()",
             (char (*) [65])"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             &local_2a8);
  paVar2 = &local_2a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2a8);
    if ((undefined8 *)CONCAT71(local_2b8._9_7_,local_2b8[8]) == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT71(local_2b8._9_7_,local_2b8[8]);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x191,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2c0,(Message *)&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    if ((long *)local_2a8._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_2a8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_2a8._M_dataplus._M_p + 8))();
      }
      local_2a8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2b8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_2c0.data_ = (AssertHelperData *)0xbefe33cc397c;
  AVar6 = cfd::core::ConfidentialValue::GetAmount(&local_288.value);
  local_2b8._0_8_ = AVar6.amount_;
  local_2b8[8] = AVar6.ignore_check_;
  local_180 = cfd::core::Amount::GetSatoshiValue((Amount *)local_2b8);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&local_2a8,"int64_t{209998999992700}",
             "unblind_data.value.GetAmount().GetSatoshiValue()",(long *)&local_2c0,&local_180);
  if ((char)local_2a8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_2b8);
    if ((undefined8 *)local_2a8._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_2a8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x193,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2c0,(Message *)local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_2b8._0_8_ + 8))();
      }
      local_2b8._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2a8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_2a8,&local_288.abf);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)local_2b8,
             "\"6b49938ded88d5c2c335133665158134041769882dd560ca47c14631052a981c\"",
             "unblind_data.abf.GetHex()",
             (char (*) [65])"6b49938ded88d5c2c335133665158134041769882dd560ca47c14631052a981c",
             &local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2a8);
    if ((undefined8 *)CONCAT71(local_2b8._9_7_,local_2b8[8]) == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT71(local_2b8._9_7_,local_2b8[8]);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x195,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2c0,(Message *)&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    if ((long *)local_2a8._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_2a8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_2a8._M_dataplus._M_p + 8))();
      }
      local_2a8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2b8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_2a8,&local_288.vbf);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)local_2b8,
             "\"0e396bcbc4c0b74329712b1b5c7f8c9c4f054996da3748b8820563f68a07dedd\"",
             "unblind_data.vbf.GetHex()",
             (char (*) [65])"0e396bcbc4c0b74329712b1b5c7f8c9c4f054996da3748b8820563f68a07dedd",
             &local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2a8);
    if ((undefined8 *)CONCAT71(local_2b8._9_7_,local_2b8[8]) == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT71(local_2b8._9_7_,local_2b8[8]);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x197,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2c0,(Message *)&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    if ((long *)local_2a8._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_2a8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_2a8._M_dataplus._M_p + 8))();
      }
      local_2a8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2b8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_288.value._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_006a2070;
  if (local_288.value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.value.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_288.vbf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_006a24b0;
  if (local_288.vbf.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.vbf.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_288.abf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_006a24b0;
  if (local_288.abf.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.abf.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_288.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_006a21d8;
  if (local_288.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.asset.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_178.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&local_140);
  if (local_158.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_1f8._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_006a23c0;
  if (local_1f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_1d0._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_006a2070;
  if (local_1d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_1a8._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_006a21d8;
  if (local_1a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::Script::~Script(&local_48);
  return;
}

Assistant:

TEST(ConfidentialTxOut, Setter) {
  ConfidentialTxOut txout;

  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 0);
  EXPECT_STREQ(txout.GetWitnessHash().GetHex().c_str(),
    "7d993a3ac51b76589a07c59078e2e4241f4c13c5190a763f22213e0c9ed8e7d5");

  txout.SetValue(Amount::CreateBySatoshiAmount(100000000));

  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(),
      "010000000005f5e100");
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 100000000);

  txout.SetCommitment(exp_asset, exp_value, exp_nonce, exp_surjection_proof,
                      exp_range_proof);
  EXPECT_STREQ(txout.GetWitnessHash().GetHex().c_str(),
    "51e1922fa92165e1705155a1973d9c3b78cbc253ec185f58a4d53a59b3eee093");

  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), exp_nonce.GetHex().c_str());
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(),
               exp_range_proof.GetHex().c_str());
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(),
               exp_surjection_proof.GetHex().c_str());
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 100000000);

  ConfidentialTxOutReference txout_ref(txout);
  EXPECT_STREQ(txout_ref.GetAsset().GetHex().c_str(),
               exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetNonce().GetHex().c_str(),
               exp_nonce.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(),
               exp_range_proof.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(),
               exp_surjection_proof.GetHex().c_str());
  EXPECT_EQ(txout_ref.GetValue().GetSatoshiValue(), 100000000);
}